

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void parse_vm(options_description *opts,variables_map *vm)

{
  size_type sVar1;
  ostream *poVar2;
  allocator local_39;
  key_type local_38;
  
  std::__cxx11::string::string((string *)&local_38,"help",&local_39);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(vm + 0x10),&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (sVar1 != 0) {
    poVar2 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,opts);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void parse_vm(const options_description &opts, const variables_map &vm)
{
    if (vm.count("help")) {
        cout << opts << endl;
    }
}